

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile.cpp
# Opt level: O1

void __thiscall LogFile::RollFile(LogFile *this)

{
  time_t nowTime;
  WriteFile *this_00;
  LogFile *this_01;
  string sLogName;
  string local_68;
  string local_48;
  
  this_01 = (LogFile *)0x0;
  nowTime = time((time_t *)0x0);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  GetFileName(this_01,nowTime,&local_68);
  this_00 = (WriteFile *)operator_new(0x10010);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  WriteFile::WriteFile(this_00,&local_48);
  std::__uniq_ptr_impl<WriteFile,_std::default_delete<WriteFile>_>::reset
            ((__uniq_ptr_impl<WriteFile,_std::default_delete<WriteFile>_> *)this,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  this->m_cnt = 0;
  this->m_writedSize = 0;
  this->m_lastFlushTime = nowTime;
  this->m_lastRollTime = nowTime;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LogFile::RollFile()
{
	time_t nowTime = time(NULL);
	std::string sLogName;
	GetFileName(nowTime, sLogName);
	m_ptWriteFile.reset(new WriteFile(sLogName));
	m_cnt = 0;
	m_writedSize = 0;
	m_lastFlushTime = nowTime;
	m_lastRollTime = nowTime;
}